

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.c
# Opt level: O0

int32_t get_component_index(ecs_world_t *world,ecs_table_t *table,ecs_type_t table_type,
                           ecs_entity_t *component_out,int32_t column_index,ecs_sig_oper_kind_t op,
                           trait_offset_t *trait_offsets,int32_t count)

{
  _Bool _Var1;
  int32_t iVar2;
  ulong *puVar3;
  void *pvVar4;
  int *piVar5;
  EcsComponent *data;
  ecs_entity_t *trait_1;
  ecs_entity_t lo;
  ecs_entity_t *trait;
  ecs_entity_t component;
  int32_t result;
  ecs_sig_oper_kind_t op_local;
  int32_t column_index_local;
  ecs_entity_t *component_out_local;
  ecs_type_t table_type_local;
  ecs_table_t *table_local;
  ecs_world_t *world_local;
  
  component._4_4_ = 0;
  trait = (ecs_entity_t *)*component_out;
  if (trait != (ecs_entity_t *)0x0) {
    if (((ulong)trait & 0xff00000000000000) == 0xfc00000000000000) {
      iVar2 = ecs_table_switch_from_case(world,table,(ecs_entity_t)trait);
      _ecs_assert(iVar2 != -1,0xc,(char *)0x0,"result != -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                  ,0x175);
      if (iVar2 == -1) {
        __assert_fail("result != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x175,
                      "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                     );
      }
      component._4_4_ = table->sw_column_offset + iVar2;
    }
    else if (((ulong)trait & 0xff00000000000000) == 0xfa00000000000000) {
      if (((ulong)trait & 0xffffff00000000) == 0) {
        _ecs_assert(trait_offsets != (trait_offset_t *)0x0,0xc,(char *)0x0,"trait_offsets != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                    ,0x17f);
        if (trait_offsets == (trait_offset_t *)0x0) {
          __assert_fail("trait_offsets != ((void*)0)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                        ,0x17f,
                        "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                       );
        }
        trait = (ecs_entity_t *)((ulong)trait & 0xffffffffffffff);
        component._4_4_ =
             get_trait_index(table_type,(ecs_entity_t)trait,column_index,trait_offsets,count);
        if (component._4_4_ != -1) {
          puVar3 = (ulong *)_ecs_vector_get(table_type,8,0x10,component._4_4_);
          *component_out = *puVar3;
          pvVar4 = ecs_get_w_entity(world,(ecs_entity_t)trait,1);
          if (pvVar4 == (void *)0x0) {
            trait = (ecs_entity_t *)(*puVar3 & 0xffffffff);
          }
        }
      }
      else {
        if (((ulong)trait & 0xffffffff) == 0x11b) {
          _ecs_assert(trait_offsets != (trait_offset_t *)0x0,0xc,(char *)0x0,"trait_offsets != NULL"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x19f);
          if (trait_offsets == (trait_offset_t *)0x0) {
            __assert_fail("trait_offsets != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x19f,
                          "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                         );
          }
          iVar2 = get_trait_index(table_type,(ulong)((uint)((ulong)trait >> 0x20) & 0xffffff),
                                  column_index,trait_offsets,count);
          _ecs_assert(iVar2 != -1,0xc,(char *)0x0,"result != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x1ae);
          if (iVar2 == -1) {
            __assert_fail("result != -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x1ae,
                          "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                         );
          }
          puVar3 = (ulong *)_ecs_vector_get(table_type,8,0x10,iVar2);
          _ecs_assert(puVar3 != (ulong *)0x0,0xc,(char *)0x0,"trait != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                      ,0x1b3);
          if (puVar3 == (ulong *)0x0) {
            __assert_fail("trait != ((void*)0)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O0/flecs-clone-prefix/src/flecs-clone/src/query.c"
                          ,0x1b3,
                          "int32_t get_component_index(ecs_world_t *, ecs_table_t *, ecs_type_t, ecs_entity_t *, int32_t, ecs_sig_oper_kind_t, trait_offset_t *, int32_t)"
                         );
          }
          trait = (ecs_entity_t *)(*puVar3 & 0xffffffff);
          *component_out = (ecs_entity_t)trait;
        }
        component._4_4_ = ecs_type_index_of(table_type,(ecs_entity_t)trait);
      }
    }
    else {
      component._4_4_ = ecs_type_index_of(table_type,(ecs_entity_t)trait);
    }
    if (component._4_4_ != -1) {
      component._4_4_ = component._4_4_ + 1;
    }
    if ((((ulong)trait & 0xff00000000000000) != 0xfc00000000000000) &&
       (((ulong)trait & 0xff00000000000000) != 0xfb00000000000000)) {
      trait = (ecs_entity_t *)ecs_get_typeid(world,(ecs_entity_t)trait);
      piVar5 = (int *)ecs_get_w_entity(world,(ecs_entity_t)trait,1);
      if ((piVar5 == (int *)0x0) || (*piVar5 == 0)) {
        component._4_4_ = 0;
      }
    }
  }
  if (op == EcsOperAll) {
    component._4_4_ = 0;
  }
  else if ((op == EcsOperOptional) &&
          (_Var1 = ecs_type_has_entity(world,table_type,(ecs_entity_t)trait), !_Var1)) {
    component._4_4_ = 0;
  }
  return component._4_4_;
}

Assistant:

static
int32_t get_component_index(
    ecs_world_t *world,
    ecs_table_t *table,
    ecs_type_t table_type,
    ecs_entity_t *component_out,
    int32_t column_index,
    ecs_sig_oper_kind_t op,
    trait_offset_t *trait_offsets,
    int32_t count)
{
    int32_t result = 0;
    ecs_entity_t component = *component_out;

    if (component) {
        /* If requested component is a case, find the corresponding switch to
         * lookup in the table */
        if (ECS_HAS_ROLE(component, CASE)) {
            result = ecs_table_switch_from_case(
                world, table, component);
            ecs_assert(result != -1, ECS_INTERNAL_ERROR, NULL);

            result += table->sw_column_offset;
        } else
        if (ECS_HAS_ROLE(component, TRAIT)) { 
            /* If only the lo part of the trait identifier is set, interpret it
             * as the trait to match. This will match any instance of the trait
             * on the entity and in a signature looks like "TRAIT | MyTrait". */
            if (!ecs_entity_t_hi(component & ECS_COMPONENT_MASK)) {
                ecs_assert(trait_offsets != NULL, 
                    ECS_INTERNAL_ERROR, NULL);

                /* Strip the TRAIT role */
                component &= ECS_COMPONENT_MASK;

                /* Get index of trait. Start looking from the last trait index
                 * as this may not be the first instance of the trait. */
                result = get_trait_index(
                    table_type, component, column_index, trait_offsets, count);
                
                if (result != -1) {
                    /* If component of current column is a trait, get the actual 
                     * trait type for the table, so the system can see which 
                     * component the trait was applied to */   
                    ecs_entity_t *trait = ecs_vector_get(
                        table_type, ecs_entity_t, result);
                    *component_out = *trait;

                    /* Check if the trait is a tag or whether it has data */
                    if (ecs_get(world, component, EcsComponent) == NULL) {
                        /* If trait has no data associated with it, use the
                         * component to which the trait has been added */
                        component = ecs_entity_t_lo(*trait);
                    }
                }
            } else {
                /* If trait does have the hi part of the identifier set, this is
                 * a fully qualified trait identifier. In a signature this looks
                 * like "TRAIT | MyTrait > Comp". */
                ecs_entity_t lo = ecs_entity_t_lo(component);
                if (lo == EcsWildcard) {
                    ecs_assert(trait_offsets != NULL, 
                        ECS_INTERNAL_ERROR, NULL);

                    /* Get id for the trait to lookup by taking the trait from
                     * the high 32 bits, move it to the low 32 bits, and reapply
                     * the TRAIT mask. */
                    component = ecs_entity_t_hi(component & ECS_COMPONENT_MASK);

                    /* If the low part of the identifier is the wildcard entity,
                     * this column is requesting the component to which the 
                     * trait is applied. First, find the component identifier */
                    result = get_trait_index(table_type, component, 
                        column_index, trait_offsets, count);

                    /* Type must have the trait, otherwise table would not have
                     * matched */
                    ecs_assert(result != -1, ECS_INTERNAL_ERROR, NULL);

                    /* Get component id at returned index */
                    ecs_entity_t *trait = ecs_vector_get(
                        table_type, ecs_entity_t, result);
                    ecs_assert(trait != NULL, ECS_INTERNAL_ERROR, NULL);

                    /* Get the lower part of the trait id. This is the component
                     * we're looking for. */
                    component = ecs_entity_t_lo(*trait);
                    *component_out = component;

                    /* Now lookup the component as usual */
                }

                /* If the low part is a regular entity (component), then
                 * this query exactly matches a single trait instance. In
                 * this case we can simply do a lookup of the trait 
                 * identifier in the table type. */
                result = ecs_type_index_of(table_type, component);
            }
        } else {
            /* Get column index for component */
            result = ecs_type_index_of(table_type, component);
        }

        /* If column is found, add one to the index, as column zero in
        * a table is reserved for entity id's */
        if (result != -1) {
            result ++;
        }

        /* Check if component is a tag. If it is, set table_data to
        * zero, so that a system won't try to access the data */
        if (!ECS_HAS_ROLE(component, CASE) && 
            !ECS_HAS_ROLE(component, SWITCH)) 
        {
            component = ecs_get_typeid(world, component);
            const EcsComponent *data = ecs_get(
                world, component, EcsComponent);

            if (!data || !data->size) {
                result = 0;
            }
        }        

        /* ecs_table_column_offset may return -1 if the component comes
         * from a prefab. If so, the component will be resolved as a
         * reference (see below) */           
    }

    if (op == EcsOperAll) {
        result = 0;
    } else if (op == EcsOperOptional) {
        /* If table doesn't have the field, mark it as no data */
        if (!ecs_type_has_entity(world, table_type, component)) {
            result = 0;
        }
    }

    return result;
}